

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O3

vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_> * __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::getSampleArgs
          (vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
           *__return_storage_ptr__,Generator *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  Texture2DGradientTestCase *pTVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float local_128 [4];
  undefined1 local_118 [68];
  undefined8 uStack_d4;
  undefined4 local_cc;
  float local_c8 [4];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  value_type local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = this->m_testCase;
  if (pTVar5->m_useDerivatives == false) {
    if (((pTVar5->m_dimensions).m_data[0] & 0x40000000) == 0) {
      iVar4 = 0;
      do {
        if ((*(byte *)((long)(pTVar5->m_dimensions).m_data + 7) & 0x40) == 0) {
          iVar6 = 0;
          do {
            local_128[1] = (float)iVar6;
            local_128[2] = 0.0;
            local_128[3] = 0.0;
            lVar7 = 0;
            local_128[0] = (float)iVar4;
            do {
              local_118._32_16_ = ZEXT816(0);
              local_118._16_4_ = 0.0;
              local_118._20_4_ = 0.0;
              local_118._24_4_ = 0.0;
              local_118._28_4_ = 0.0;
              uVar1 = *(undefined8 *)(this->m_testCase->m_dimensions).m_data;
              auVar9._0_4_ = (float)((int)uVar1 * 2);
              auVar9._4_4_ = (float)((int)((ulong)uVar1 >> 0x20) * 2);
              auVar9._8_8_ = 0;
              auVar10._4_4_ = local_128[1];
              auVar10._0_4_ = local_128[0];
              auVar10._8_4_ = local_128[2];
              auVar10._12_4_ = local_128[3];
              auVar10 = divps(auVar10,auVar9);
              local_118._0_8_ = auVar10._0_8_;
              local_118._8_4_ = 0.0;
              local_118._12_4_ = 0.0;
              local_118._52_4_ = *(float *)((long)&DAT_00b27c70 + lVar7);
              std::
              vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
              ::push_back(__return_storage_ptr__,(value_type *)local_118);
              lVar7 = lVar7 + 4;
            } while (lVar7 != 0x1c);
            pTVar5 = this->m_testCase;
            bVar2 = iVar6 < (pTVar5->m_dimensions).m_data[1] * 2;
            iVar6 = iVar6 + 1;
          } while (bVar2);
        }
        bVar2 = iVar4 < (pTVar5->m_dimensions).m_data[0] * 2;
        iVar4 = iVar4 + 1;
      } while (bVar2);
    }
  }
  else {
    local_118._16_4_ = 0.0;
    local_118._20_4_ = 0.0;
    local_118._24_4_ = 0.0;
    local_118._28_4_ = 0.0;
    local_118._0_4_ = 0.0;
    local_118._4_4_ = 0.0;
    local_118._8_4_ = 0.0;
    local_118._12_4_ = 0.0;
    local_118._32_4_ = _DAT_00b276b0;
    local_118._36_4_ = _UNK_00b276b4;
    local_118._40_4_ = _UNK_00b276b8;
    local_118._44_4_ = _UNK_00b276bc;
    local_118._48_4_ = 1.0;
    local_118._52_4_ = 1.0;
    local_118._56_4_ = 1.0;
    local_118._60_8_ = 0;
    uStack_d4 = 0;
    local_cc = 0;
    local_c8[0] = _DAT_00b276b0;
    local_c8[1] = _UNK_00b276b4;
    local_c8[2] = _UNK_00b276b8;
    local_c8[3] = _UNK_00b276bc;
    local_b8 = 0x3f8000003f800000;
    local_b0 = 0x3f800000;
    local_ac = 0;
    uStack_a4 = 0;
    local_9c = 0;
    local_98 = 0x4000000040000000;
    uStack_90 = 0x40000000;
    local_88 = 0x4000000040000000;
    uStack_80 = 0x40000000;
    if (((pTVar5->m_dimensions).m_data[0] & 0x40000000) == 0) {
      iVar4 = 0;
      do {
        if ((*(byte *)((long)(pTVar5->m_dimensions).m_data + 7) & 0x40) == 0) {
          iVar6 = 0;
          do {
            local_128[1] = (float)iVar6;
            local_128[2] = 0.0;
            local_128[3] = 0.0;
            lVar7 = 0x10;
            local_128[0] = (float)iVar4;
            do {
              local_78.dPdx.m_data[0] = 0.0;
              local_78.dPdx.m_data[1] = 0.0;
              uVar1 = *(undefined8 *)(this->m_testCase->m_dimensions).m_data;
              auVar8._0_4_ = (float)((int)uVar1 * 2);
              auVar8._4_4_ = (float)((int)((ulong)uVar1 >> 0x20) * 2);
              auVar8._8_8_ = 0;
              auVar3._4_4_ = local_128[1];
              auVar3._0_4_ = local_128[0];
              auVar3._8_4_ = local_128[2];
              auVar3._12_4_ = local_128[3];
              auVar10 = divps(auVar3,auVar8);
              local_78.coord.m_data[0] = (float)auVar10._0_8_;
              local_78.coord.m_data[1] = SUB84(auVar10._0_8_,4);
              local_78.coord.m_data[2] = 0.0;
              local_78.coord.m_data[3] = 0.0;
              local_78.dPdx.m_data._8_8_ = *(undefined8 *)((long)local_128 + lVar7 + 8);
              local_78.dPdx.m_data._0_8_ = *(undefined8 *)((long)local_128 + lVar7);
              local_78.dPdy.m_data._0_8_ = *(undefined8 *)(local_118 + lVar7);
              local_78.dPdy.m_data._8_8_ = *(undefined8 *)(local_118 + lVar7 + 8);
              std::
              vector<vkt::texture::SampleArguments,_std::allocator<vkt::texture::SampleArguments>_>
              ::push_back(__return_storage_ptr__,&local_78);
              lVar7 = lVar7 + 0x20;
            } while (lVar7 != 0xb0);
            pTVar5 = this->m_testCase;
            bVar2 = iVar6 < (pTVar5->m_dimensions).m_data[1] * 2;
            iVar6 = iVar6 + 1;
          } while (bVar2);
        }
        bVar2 = iVar4 < (pTVar5->m_dimensions).m_data[0] * 2;
        iVar4 = iVar4 + 1;
      } while (bVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<SampleArguments> getSampleArgs (void) const
	{
		std::vector<SampleArguments> args;

		if (m_testCase->m_useDerivatives)
		{
			struct
			{
				Vec4 dPdx;
				Vec4 dPdy;
			}
			derivativePairs[] =
			{
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(0.0f, 0.0f, 0.0f, 0.0f), Vec4(1.0f, 1.0f, 1.0f, 0.0f)},
				{Vec4(1.0f, 1.0f, 1.0f, 0.0f), Vec4(0.0f, 0.0f, 0.0f, 0.0f)},
				{Vec4(2.0f, 2.0f, 2.0f, 0.0f), Vec4(2.0f, 2.0f, 2.0f, 0.0f)}
			};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
				    for (deUint32 derivNdx = 0; derivNdx < DE_LENGTH_OF_ARRAY(derivativePairs); ++derivNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.dPdx = derivativePairs[derivNdx].dPdx;
						cur.dPdy = derivativePairs[derivNdx].dPdy;

						args.push_back(cur);
					}
				}
			}
		}
		else
		{
			const float lodList[] = {-1.0, -0.5, 0.0, 0.5, 1.0, 1.5, 2.0};

			for (deInt32 i = 0; i < 2 * m_testCase->m_dimensions[0] + 1; ++i)
			{
				for (deInt32 j = 0; j < 2 * m_testCase->m_dimensions[1] + 1; ++j)
				{
					for (deUint32 lodNdx = 0; lodNdx < DE_LENGTH_OF_ARRAY(lodList); ++lodNdx)
					{
						SampleArguments cur;
						cur.coord = Vec4((float)i / (float)(2 * m_testCase->m_dimensions[0]),
										 (float)j / (float)(2 * m_testCase->m_dimensions[1]),
										 0.0f, 0.0f);
						cur.lod = lodList[lodNdx];

						args.push_back(cur);
					}
				}
			}
		}

		return args;
	}